

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::TryCast::Operation<float,unsigned_int>(float input,uint32_t *result,bool strict)

{
  bool bVar1;
  
  bVar1 = NumericTryCast::Operation<float,unsigned_int>(input,result,strict);
  return bVar1;
}

Assistant:

bool TryCast::Operation(float input, uint32_t &result, bool strict) {
	return NumericTryCast::Operation<float, uint32_t>(input, result, strict);
}